

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instantiation.cpp
# Opt level: O1

void __thiscall
Inferences::Instantiation::tryMakeLiteralFalse
          (Instantiation *this,Literal *lit,Stack<Kernel::Substitution> *subs)

{
  Substitution *pSVar1;
  SaturationAlgorithm *pSVar2;
  undefined8 uVar3;
  Entry *pEVar4;
  Entry *pEVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  Interpretation IVar9;
  Term *pTVar10;
  ulong uVar11;
  uint uVar12;
  socklen_t __len;
  ulong uVar13;
  int extraout_EDX;
  int __fd;
  Instantiation *this_00;
  Term *term;
  Substitution s2;
  Substitution s1;
  VariableIterator vit;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> local_110;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> local_e8;
  VariableIterator local_c0;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> local_78;
  undefined1 local_50 [32];
  Entry *pEStack_30;
  Entry *pEVar14;
  
  bVar8 = Kernel::Theory::isInterpretedPredicate
                    ((Theory *)Kernel::theory,(lit->super_Term)._functor);
  if (((bVar8) &&
      (IVar9 = Kernel::Theory::interpretPredicate((Theory *)Kernel::theory,lit),
      IVar9 < REAL_LESS_EQUAL)) && ((0x204041U >> (IVar9 & INT_REMAINDER_E) & 1) != 0)) {
    uVar12 = *(uint *)&(lit->super_Term).field_0xc & 0xfffffff;
    pTVar10 = (Term *)(lit->super_Term)._args[uVar12]._content;
    if ((((ulong)pTVar10 & 1) == 0) ||
       (term = (Term *)(lit->super_Term)._args[(ulong)uVar12 - 1]._content, ((ulong)term & 1) != 0))
    {
      term = (Term *)0x0;
      __fd = extraout_EDX;
    }
    else {
      __fd = (int)((ulong)pTVar10 >> 2);
    }
    uVar11 = (lit->super_Term)._args[(ulong)uVar12 - 1]._content;
    bVar8 = (uVar11 & 1) == 0;
    uVar13 = (ulong)CONCAT31((int3)(uVar12 >> 8),bVar8 | (byte)pTVar10);
    if (!bVar8 && ((ulong)pTVar10 & 1) == 0) {
      term = pTVar10;
      __fd = (int)(uVar11 >> 2);
    }
    if (term != (Term *)0x0) {
      Kernel::VariableIterator::VariableIterator(&local_c0,term);
      do {
        bVar8 = Kernel::VariableIterator::hasNext(&local_c0);
        if (!bVar8) {
          local_e8._timestamp = 1;
          local_e8._size = 0;
          local_e8._deleted = 0;
          local_e8._capacityIndex = 0;
          local_e8._capacity = 0;
          local_e8._20_8_ = 0;
          local_e8._28_8_ = 0;
          local_e8._afterLast._4_4_ = 0;
          Kernel::Substitution::bind
                    ((Substitution *)&local_e8,__fd,(sockaddr *)term,(socklen_t)uVar13);
          ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
                    ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                     local_50,&local_e8);
          if (subs->_cursor == subs->_end) {
            ::Lib::Stack<Kernel::Substitution>::expand(subs);
          }
          pSVar1 = subs->_cursor;
          (pSVar1->_map)._timestamp = 1;
          (pSVar1->_map)._size = 0;
          (pSVar1->_map)._deleted = 0;
          (pSVar1->_map)._capacityIndex = 0;
          (pSVar1->_map)._capacity = 0;
          *(undefined8 *)&(pSVar1->_map)._nextExpansionOccupancy = 0;
          *(undefined8 *)((long)&(pSVar1->_map)._entries + 4) = 0;
          *(undefined4 *)((long)&(pSVar1->_map)._afterLast + 4) = 0;
          this_00 = (Instantiation *)local_50;
          (pSVar1->_map)._timestamp = local_50._0_4_;
          local_50._0_4_ = 1;
          (pSVar1->_map)._size = local_50._4_4_;
          local_50._4_4_ = 0;
          pSVar2 = *(SaturationAlgorithm **)&(pSVar1->_map)._deleted;
          uVar3._0_4_ = (pSVar1->_map)._capacity;
          uVar3._4_4_ = (pSVar1->_map)._nextExpansionOccupancy;
          (pSVar1->_map)._deleted = local_50._8_4_;
          (pSVar1->_map)._capacityIndex = local_50._12_4_;
          (pSVar1->_map)._capacity = local_50._16_4_;
          (pSVar1->_map)._nextExpansionOccupancy = local_50._20_4_;
          pEVar4 = (pSVar1->_map)._entries;
          pEVar5 = (pSVar1->_map)._afterLast;
          (pSVar1->_map)._entries = (Entry *)local_50._24_8_;
          (pSVar1->_map)._afterLast = pEStack_30;
          subs->_cursor = subs->_cursor + 1;
          pEVar14 = pEStack_30;
          local_50._8_8_ = pSVar2;
          local_50._16_8_ = uVar3;
          local_50._24_8_ = pEVar4;
          pEStack_30 = pEVar5;
          ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                    ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                     this_00);
          __len = (socklen_t)pEVar14;
          if ((((lit->super_Term)._args[0]._content & 4) != 0) &&
             (pTVar10 = tryGetDifferentValue(this_00,term), pTVar10 != (Term *)0x0)) {
            local_110._timestamp = 1;
            local_110._size = 0;
            local_110._deleted = 0;
            local_110._capacityIndex = 0;
            local_110._capacity = 0;
            local_110._20_8_ = 0;
            local_110._28_8_ = 0;
            local_110._afterLast._4_4_ = 0;
            Kernel::Substitution::bind((Substitution *)&local_110,__fd,(sockaddr *)pTVar10,__len);
            ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
                      (&local_78,&local_110);
            if (subs->_cursor == subs->_end) {
              ::Lib::Stack<Kernel::Substitution>::expand(subs);
            }
            pSVar1 = subs->_cursor;
            (pSVar1->_map)._timestamp = 1;
            (pSVar1->_map)._size = 0;
            (pSVar1->_map)._deleted = 0;
            (pSVar1->_map)._capacityIndex = 0;
            (pSVar1->_map)._capacity = 0;
            *(undefined8 *)&(pSVar1->_map)._nextExpansionOccupancy = 0;
            *(undefined8 *)((long)&(pSVar1->_map)._entries + 4) = 0;
            *(undefined4 *)((long)&(pSVar1->_map)._afterLast + 4) = 0;
            (pSVar1->_map)._timestamp = local_78._timestamp;
            local_78._timestamp = 1;
            (pSVar1->_map)._size = local_78._size;
            local_78._size = 0;
            uVar6._0_4_ = (pSVar1->_map)._deleted;
            uVar6._4_4_ = (pSVar1->_map)._capacityIndex;
            uVar7._0_4_ = (pSVar1->_map)._capacity;
            uVar7._4_4_ = (pSVar1->_map)._nextExpansionOccupancy;
            (pSVar1->_map)._deleted = local_78._deleted;
            (pSVar1->_map)._capacityIndex = local_78._capacityIndex;
            (pSVar1->_map)._capacity = local_78._capacity;
            (pSVar1->_map)._nextExpansionOccupancy = local_78._nextExpansionOccupancy;
            pEVar4 = (pSVar1->_map)._entries;
            pEVar5 = (pSVar1->_map)._afterLast;
            (pSVar1->_map)._entries = local_78._entries;
            (pSVar1->_map)._afterLast = local_78._afterLast;
            subs->_cursor = subs->_cursor + 1;
            local_78._8_8_ = uVar6;
            local_78._16_8_ = uVar7;
            local_78._entries = pEVar4;
            local_78._afterLast = pEVar5;
            ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
            ~DHMap(&local_78);
            ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
            ~DHMap(&local_110);
          }
          ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                    (&local_e8);
          break;
        }
        local_c0._used = true;
      } while (__fd != (int)(local_c0._stack._cursor[-1]->_content >> 2));
      local_c0.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore =
           (_func_int **)&PTR__VariableIterator_00b697b8;
      if (local_c0._stack._stack != (TermList **)0x0) {
        uVar11 = local_c0._stack._capacity * 8 + 0xf & 0xfffffffffffffff0;
        if (uVar11 == 0) {
          *local_c0._stack._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_c0._stack._stack;
        }
        else if (uVar11 < 0x11) {
          *local_c0._stack._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_c0._stack._stack;
        }
        else if (uVar11 < 0x19) {
          *local_c0._stack._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_c0._stack._stack;
        }
        else if (uVar11 < 0x21) {
          *local_c0._stack._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_c0._stack._stack;
        }
        else if (uVar11 < 0x31) {
          *local_c0._stack._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_c0._stack._stack;
        }
        else if (uVar11 < 0x41) {
          *local_c0._stack._stack = (TermList *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_c0._stack._stack;
        }
        else {
          operator_delete(local_c0._stack._stack,0x10);
        }
      }
    }
  }
  return;
}

Assistant:

void Instantiation::tryMakeLiteralFalse(Literal* lit, Stack<Substitution>& subs)
{
  if(theory->isInterpretedPredicate(lit->functor())){
    Interpretation itp = theory->interpretPredicate(lit);
    //unsigned sort = theory->getOperationSort(interpretation);

    //TODO, very limited consideration, expand
    if (itp == Theory::EQUAL || itp == Theory::INT_LESS || itp == Theory::RAT_LESS || itp == Theory::REAL_LESS) {
      TermList* left = lit->nthArgument(0); TermList* right = lit->nthArgument(1);
      unsigned var;
      Term* t = 0;
      if(left->isVar() && !right->isVar()){
       t = right->term();
       var = left->var();
      }
      if(right->isVar() && !left->isVar()){
       t = left->term();
       var = right->var();
      }
      if(t){
        // do occurs check
        VariableIterator vit(t);
        while(vit.hasNext()) if(vit.next().var()==var) return;

        // we are okay
        Substitution s1;
        s1.bind(var,t);
        subs.push(s1);
        if(lit->polarity()){
         t = tryGetDifferentValue(t);
         if(t){
           Substitution s2;
           s2.bind(var,t);
           subs.push(s2);
         }
        }
      }
    }
    // TODO cover other cases ...
  }
}